

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_destroy(opj_mqc_t *mqc)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    free(in_RDI);
  }
  return;
}

Assistant:

void mqc_destroy(opj_mqc_t *mqc) {
	if(mqc) {
#ifdef MQC_PERF_OPT
		if (mqc->buffer) {
			opj_free(mqc->buffer);
		}
#endif
		opj_free(mqc);
	}
}